

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O2

int __thiscall DIS::SystemIdentifier::getMarshalledSize(SystemIdentifier *this)

{
  return 6;
}

Assistant:

int SystemIdentifier::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 2;  // _systemType
   marshalSize = marshalSize + 2;  // _systemName
   marshalSize = marshalSize + 1;  // _systemMode
   marshalSize = marshalSize + 1;  // _changeOptions
    return marshalSize;
}